

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::ClassName
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *out_suffix_added)

{
  long *plVar1;
  long lVar2;
  Descriptor *descriptor_00;
  string prefix;
  string name;
  string local_80;
  string local_60;
  string local_40;
  
  plVar1 = *(long **)(*(long *)(*(long *)(descriptor + 0x10) + 0x88) + 0x60);
  lVar2 = *plVar1;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,lVar2,plVar1[1] + lVar2);
  ClassNameWorker_abi_cxx11_(&local_40,(objectivec *)descriptor,descriptor_00);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"_Class","");
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_60,&local_40,&local_80,out_suffix_added);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Descriptor* descriptor, string* out_suffix_added) {
  // 1. Message names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the very end and then suffix things.
  const string prefix = FileClassPrefix(descriptor->file());
  const string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix, name, "_Class", out_suffix_added);
}